

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

size_t MeCab::tokenize2<char**>(char *str,char *del,char **out,size_t max)

{
  size_t sVar1;
  char *pcVar2;
  char *__last1;
  size_t sVar3;
  
  sVar1 = strlen(str);
  __last1 = str + sVar1;
  sVar1 = strlen(del);
  sVar3 = 0;
  do {
    if (max <= sVar3) {
      return sVar3;
    }
    pcVar2 = std::find_first_of<char*,char_const*>(str,__last1,del,del + sVar1);
    *pcVar2 = '\0';
    if (*str != '\0') {
      *out = str;
      out = out + 1;
      sVar3 = sVar3 + 1;
    }
    str = pcVar2 + 1;
  } while (pcVar2 != __last1);
  return sVar3;
}

Assistant:

inline size_t tokenize2(char *str, const char *del,
                        Iterator out, size_t max) {
  char *stre = str + std::strlen(str);
  const char *dele = del + std::strlen(del);
  size_t size = 0;

  while (size < max) {
    char *n = std::find_first_of(str, stre, del, dele);
    *n = '\0';
    if (*str != '\0') {
      *out++ = str;
      ++size;
    }
    if (n == stre) break;
    str = n + 1;
  }

  return size;
}